

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kdasm.c
# Opt level: O3

void d68010_moves_8(void)

{
  uint uVar1;
  char *pcVar2;
  uint in_EDI;
  
  if (((byte)g_cpu_type & 0x1e) == 0) {
    if ((~g_cpu_ir & 0xf000) == 0) {
      pcVar2 = "dc.w    $%04x; opcode 1111";
    }
    else {
      pcVar2 = "dc.w $%04x; ILLEGAL";
    }
    sprintf(g_dasm_str,pcVar2);
    return;
  }
  uVar1 = dasm_read_imm_16(in_EDI);
  if ((uVar1 >> 0xb & 1) == 0) {
    pcVar2 = get_ea_mode_str(g_cpu_ir,0);
    sprintf(g_dasm_str,"moves.b %s, %c%d; (1+)",pcVar2,(ulong)((uint)(uVar1 < 0x8000) * 3 + 0x41),
            (ulong)(uVar1 >> 0xc & 7));
    return;
  }
  pcVar2 = get_ea_mode_str(g_cpu_ir,0);
  sprintf(g_dasm_str,"moves.b %c%d, %s; (1+)",(ulong)((uint)(uVar1 < 0x8000) * 3 + 0x41),
          (ulong)(uVar1 >> 0xc & 7),pcVar2);
  return;
}

Assistant:

static void d68010_moves_8(void)
{
	uint extension;
	LIMIT_CPU_TYPES(M68010_PLUS);
	extension = read_imm_16();
	if(BIT_B(extension))
		sprintf(g_dasm_str, "moves.b %c%d, %s; (1+)", BIT_F(extension) ? 'A' : 'D', (extension>>12)&7, get_ea_mode_str_8(g_cpu_ir));
	else
		sprintf(g_dasm_str, "moves.b %s, %c%d; (1+)", get_ea_mode_str_8(g_cpu_ir), BIT_F(extension) ? 'A' : 'D', (extension>>12)&7);
}